

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O2

JavascriptFunction * __thiscall
Js::JavascriptStackWalker::UpdateFrame(JavascriptStackWalker *this,bool includeInlineFrames)

{
  InlinedFrameWalker *self;
  uint uVar1;
  InterpreterStackFrame *pIVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  int loopNum;
  JavascriptFunction *obj;
  JavascriptFunction *pJVar6;
  undefined4 *puVar7;
  void *pvVar8;
  ScriptFunction *pSVar9;
  JavascriptFunction *pJVar10;
  ushort uVar11;
  char *message;
  char *error;
  byte bVar13;
  uint lineNumber;
  uint uVar12;
  
  bVar4 = CheckJavascriptFrame(this,includeInlineFrames);
  uVar1 = *(uint *)&this->field_0x50;
  *(ushort *)&this->field_0x50 = ((ushort)uVar1 & 0xfffb) + (ushort)bVar4 * 4;
  if (!bVar4 && (uVar1 & 1) == 0) {
    return (JavascriptFunction *)0x0;
  }
  obj = GetCurrentFunction(this,true);
  bVar4 = IsCurrentPhysicalFrameForLoopBody(this);
  pIVar2 = this->interpreterFrame;
  if (pIVar2 == (InterpreterStackFrame *)0x0) {
    if ((*(ushort *)&this->field_0x50 & 8) != 0) goto LAB_009d3553;
    pvVar8 = (this->lastInternalFrameInfo).codeAddress;
    uVar12 = *(ushort *)&this->field_0x50 & 2;
    uVar11 = (ushort)uVar12;
    uVar1._0_1_ = (this->lastInternalFrameInfo).hasInlinedFramesOnStack;
    uVar1._1_1_ = (this->lastInternalFrameInfo).previousInterpreterFrameIsFromBailout;
    uVar1._2_2_ = *(undefined2 *)&(this->lastInternalFrameInfo).field_0x2a;
    uVar12 = uVar12 >> 1;
    if (pvVar8 != (void *)0x0) {
      uVar12 = uVar1;
    }
    if ((!bVar4 || !includeInlineFrames) && ((uVar12 & 1) != 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x25c,
                                  "(!HasInlinedFramesOnStack() || (includeInlineFrames && isCurrentPhysicalFrameForLoopBody))"
                                  ,
                                  "!HasInlinedFramesOnStack() || (includeInlineFrames && isCurrentPhysicalFrameForLoopBody)"
                                 );
      if (!bVar4) goto LAB_009d3577;
      *puVar7 = 0;
      pvVar8 = (this->lastInternalFrameInfo).codeAddress;
      uVar1._0_1_ = (this->lastInternalFrameInfo).hasInlinedFramesOnStack;
      uVar11 = *(ushort *)&this->field_0x50 & 2;
    }
    bVar13 = uVar11 != 0;
    if (pvVar8 != (void *)0x0) {
      bVar13 = (byte)uVar1;
    }
    if (((~includeInlineFrames | bVar13) & 1) != 0) goto LAB_009d3553;
    if (pvVar8 != (void *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x262,"(lastInternalFrameInfo.codeAddress == nullptr)",
                                  "lastInternalFrameInfo.codeAddress == nullptr");
      if (!bVar4) goto LAB_009d3577;
      *puVar7 = 0;
    }
    pSVar9 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(obj);
    bVar4 = InlinedFrameWalker::FromPhysicalFrame
                      (&this->inlinedFrameWalker,&this->currentFrame,pSVar9,false,-1,
                       (JavascriptStackWalker *)0x0,false,false);
    if (!bVar4) goto LAB_009d3553;
    bVar4 = InlinedFrameWalker::Next(&this->inlinedFrameWalker,&this->inlinedFrameCallInfo);
    *(ushort *)&this->field_0x50 =
         ((ushort)*(undefined4 *)&this->field_0x50 & 0xfffc) + (ushort)bVar4 + 2;
    if (bVar4) goto LAB_009d3553;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    error = "(inlinedFramesBeingWalked)";
    message = "inlinedFramesBeingWalked";
    lineNumber = 0x271;
  }
  else {
    if ((this->lastInternalFrameInfo).codeAddress != (void *)0x0) {
      this->field_0x50 = this->field_0x50 | 0x80;
    }
    if (((byte)pIVar2[0xd4] & 8) == 0) {
      pJVar6 = StackScriptFunction::GetCurrentFunctionObject
                         (*(JavascriptFunction **)(pIVar2 + 0x80));
      if (pJVar6 != obj) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                    ,0x255,
                                    "(StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == function)"
                                    ,
                                    "StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == function"
                                   );
        if (!bVar4) goto LAB_009d3577;
        *puVar7 = 0;
      }
      this->field_0x50 = this->field_0x50 & 0xbf;
      goto LAB_009d3553;
    }
    uVar1 = *(uint *)&this->field_0x50;
    *(ushort *)&this->field_0x50 = (ushort)uVar1 | 0x40;
    if ((uVar1 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x229,"(!inlinedFramesBeingWalked)","!inlinedFramesBeingWalked");
      if (!bVar5) goto LAB_009d3577;
      *puVar7 = 0;
    }
    if (!includeInlineFrames) {
      if (bVar4) {
        SetCachedInternalFrameInfo(this,InternalFrameType_LoopBody,obj,false,true);
      }
      goto LAB_009d3553;
    }
    if (bVar4) {
      loopNum = *(int *)(this->tempInterpreterFrame + 0xcc);
    }
    else {
      loopNum = -1;
    }
    self = &this->inlinedFrameWalker;
    pSVar9 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(obj);
    bVar5 = InlinedFrameWalker::FromPhysicalFrame
                      (self,&this->currentFrame,pSVar9,true,loopNum,this,false,false);
    if (bVar5) {
      bVar4 = InlinedFrameWalker::Next(self,&this->inlinedFrameCallInfo);
      *(ushort *)&this->field_0x50 =
           ((ushort)*(undefined4 *)&this->field_0x50 & 0xfffc) + (ushort)bVar4 + 2;
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                    ,0x23d,"(inlinedFramesBeingWalked)","inlinedFramesBeingWalked");
        if (!bVar4) goto LAB_009d3577;
        *puVar7 = 0;
      }
      pJVar6 = StackScriptFunction::GetCurrentFunctionObject
                         (*(JavascriptFunction **)(this->interpreterFrame + 0x80));
      pJVar10 = InlinedFrameWalker::GetFunctionObject(self);
      if (pJVar6 == pJVar10) goto LAB_009d3553;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      error = 
      "(StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == inlinedFrameWalker.GetFunctionObject())"
      ;
      message = 
      "StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == inlinedFrameWalker.GetFunctionObject()"
      ;
      lineNumber = 0x23e;
    }
    else {
      if (!bVar4) goto LAB_009d3553;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      error = "(!isCurrentPhysicalFrameForLoopBody)";
      message = "!isCurrentPhysicalFrameForLoopBody";
      lineNumber = 0x242;
    }
  }
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                              ,lineNumber,error,message);
  if (!bVar4) {
LAB_009d3577:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar7 = 0;
LAB_009d3553:
  this->scriptContext =
       (((((obj->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  return obj;
}

Assistant:

Js::JavascriptFunction * JavascriptStackWalker::UpdateFrame(bool includeInlineFrames)
    {
        this->isJavascriptFrame = this->CheckJavascriptFrame(includeInlineFrames);

        if (this->IsJavascriptFrame())
        {
            // In case we have a cross site thunk, update the script context
            Js::JavascriptFunction *function = this->GetCurrentFunction();

#if ENABLE_NATIVE_CODEGEN
            bool isCurrentPhysicalFrameForLoopBody = this->IsCurrentPhysicalFrameForLoopBody();
#endif
            if (this->interpreterFrame)
            {
#if ENABLE_NATIVE_CODEGEN
                if (lastInternalFrameInfo.codeAddress != nullptr)
                {
                    this->previousInterpreterFrameIsForLoopBody = true;
                }
#endif

                // We might've bailed out of an inlinee, so check if there were any inlinees.
                if (this->interpreterFrame->TestFlags(InterpreterStackFrameFlags_FromBailOut))
                {
                    previousInterpreterFrameIsFromBailout = true;

#if ENABLE_NATIVE_CODEGEN
                    Assert(!inlinedFramesBeingWalked);
                    if (includeInlineFrames)
                    {
                        int loopNum = -1;
                        if (isCurrentPhysicalFrameForLoopBody)
                        {
                            loopNum = this->tempInterpreterFrame->GetCurrentLoopNum();
                        }

                        bool hasInlinedFramesOnStack = InlinedFrameWalker::FromPhysicalFrame(inlinedFrameWalker, currentFrame,
                            VarTo<ScriptFunction>(function), true /*fromBailout*/, loopNum, this, false /*useInternalFrameInfo*/, false /*noAlloc*/);

                        if (hasInlinedFramesOnStack)
                        {
                            // We're now back in the state where currentFrame == physical frame of the inliner, but
                            // since interpreterFrame != null, we'll pick values from the interpreterFrame (the bailout
                            // frame of the inliner). Set a flag to tell the stack walker that it needs to start from the
                            // inlinee frames on the stack when Walk() is called.
                            this->inlinedFramesBeingWalked = inlinedFrameWalker.Next(inlinedFrameCallInfo);
                            this->hasInlinedFramesOnStack = hasInlinedFramesOnStack;
                            Assert(inlinedFramesBeingWalked);
                            Assert(StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == inlinedFrameWalker.GetFunctionObject());
                        }
                        else
                        {
                            Assert(!isCurrentPhysicalFrameForLoopBody);
                        }
                    }
                    else if (isCurrentPhysicalFrameForLoopBody)
                    {
                        // Getting here is only possible when the current interpreterFrame is for a function which
                        // encountered a bailout after getting inlined in a jitted loop body. If we are not including
                        // inlined frames in the stack walk, we need to set the codeAddress on lastInternalFrameInfo,
                        // which would have otherwise been set upon closing the inlinedFrameWalker, now.
                        // Note that we already have an assert in CheckJavascriptFrame to ensure this.
                        SetCachedInternalFrameInfo(InternalFrameType_LoopBody, function, false /*hasInlinedFramesOnStack*/, true /*previousInterpreterFrameIsFromBailout*/);
                    }
#else
                    // How did we bail out when JIT was disabled?
                    Assert(false);
#endif
                }
                else
                {
                    Assert(StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == function);
                    previousInterpreterFrameIsFromBailout = false;
                }
            }
            else if (!this->isNativeLibraryFrame)
            {
#if ENABLE_NATIVE_CODEGEN
                Assert(!HasInlinedFramesOnStack() || (includeInlineFrames && isCurrentPhysicalFrameForLoopBody));

                if (!HasInlinedFramesOnStack() && includeInlineFrames)
                {
                    // Check whether there are inlined frames nested in this native frame. The corresponding check for
                    // a jitted loop body frame should have been done in CheckJavascriptFrame
                    Assert(lastInternalFrameInfo.codeAddress == nullptr);
                    bool inlinedFramesFound = InlinedFrameWalker::FromPhysicalFrame(
                        inlinedFrameWalker,
                        currentFrame,
                        VarTo<ScriptFunction>(function),
                        false,  // fromBailout
                        -1,     // loopNum
                        nullptr,// walker
                        false,  // useInternalFrameInfo
                        false   // noAlloc
                    );
                    if (inlinedFramesFound)
                    {
                        this->inlinedFramesBeingWalked = inlinedFrameWalker.Next(inlinedFrameCallInfo);
                        this->hasInlinedFramesOnStack = true;
                        Assert(inlinedFramesBeingWalked);
                    }
                }
#endif
            }
            this->scriptContext = function->GetScriptContext();
            return function;
        }
        return nullptr;
    }